

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Setup
          (TextbookBoyerMoore<char16_t> *this,ArenaAllocator *allocator,Char *pat,CharCount patLen,
          int skip)

{
  int32 *piVar1;
  uint uVar2;
  uint uVar3;
  CharCount v;
  ulong uVar4;
  
  if (patLen != 0) {
    uVar3 = 0;
    v = 0;
    do {
      uVar4 = (ulong)(uint)skip;
      uVar2 = uVar3;
      if (0 < skip) {
        do {
          CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Set
                    (&this->lastOccurrence,allocator,pat[uVar2],v);
          uVar2 = uVar2 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      v = v + 1;
      uVar3 = uVar3 + skip;
    } while (v != patLen);
  }
  piVar1 = TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix(allocator,pat,patLen,skip);
  Memory::Recycler::WBSetBit((char *)&this->goodSuffix);
  (this->goodSuffix).ptr = piVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->goodSuffix);
  return;
}

Assistant:

void TextbookBoyerMoore<C>::Setup(ArenaAllocator * allocator, const Char * pat, CharCount patLen, int skip)
    {
        // character c |-> index of last occurrence of c in pat, otherwise -1
        for (CharCount i = 0; i < patLen; i++)
        {
            for (int j = 0; j < skip; j++)
                lastOccurrence.Set(allocator, pat[i * skip + j], i);
        }
        goodSuffix = TextbookBoyerMooreSetup<C>::GetGoodSuffix(allocator, pat, patLen, skip);
    }